

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cpp
# Opt level: O3

void __thiscall polyscope::PointCloud::buildPickUI(PointCloud *this,size_t localPickID)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  long *plVar4;
  _Rb_tree_node_base *p_Var5;
  long *plVar6;
  size_type *psVar7;
  size_t sVar8;
  vec3 *v;
  float fVar9;
  string __str;
  string local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  char *local_48;
  uint local_40;
  char local_38 [16];
  
  cVar3 = '\x01';
  if (9 < localPickID) {
    sVar8 = localPickID;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (sVar8 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_001dd192;
      }
      if (sVar8 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_001dd192;
      }
      if (sVar8 < 10000) goto LAB_001dd192;
      bVar1 = 99999 < sVar8;
      sVar8 = sVar8 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_001dd192:
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_48,local_40,localPickID);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x2aae19);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_58 = *plVar6;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar6;
    local_68 = (long *)*plVar4;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_88.field_2._M_allocated_capacity = *psVar7;
    local_88.field_2._8_8_ = plVar4[3];
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar7;
    local_88._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_88._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  ImGui::TextUnformatted(local_88._M_dataplus._M_p,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  ImGui::SameLine(0.0,-1.0);
  to_string_abi_cxx11_
            (&local_88,
             (polyscope *)
             ((this->points).
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + localPickID),v);
  ImGui::TextUnformatted(local_88._M_dataplus._M_p,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.0);
  ImGui::Columns(2,(char *)0x0,true);
  fVar9 = ImGui::GetWindowWidth();
  ImGui::SetColumnWidth(0,fVar9 / 3.0);
  for (p_Var5 = (this->super_QuantityStructure<polyscope::PointCloud>).quantities._M_t._M_impl.
                super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 !=
      &(this->super_QuantityStructure<polyscope::PointCloud>).quantities._M_t._M_impl.
       super__Rb_tree_header; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    (**(code **)(**(long **)(p_Var5 + 2) + 0x28))(*(long **)(p_Var5 + 2),localPickID);
  }
  ImGui::Indent(-20.0);
  return;
}

Assistant:

void PointCloud::buildPickUI(size_t localPickID) {

  ImGui::TextUnformatted(("#" + std::to_string(localPickID) + "  ").c_str());
  ImGui::SameLine();
  ImGui::TextUnformatted(to_string(points[localPickID]).c_str());

  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Indent(20.);

  // Build GUI to show the quantities
  ImGui::Columns(2);
  ImGui::SetColumnWidth(0, ImGui::GetWindowWidth() / 3);
  for (auto& x : quantities) {
    x.second->buildPickUI(localPickID);
  }

  ImGui::Indent(-20.);
}